

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  void *__ptr;
  ssize_t sVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  size_t __nbytes_00;
  char buffer_header [8];
  size_t local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_50 = 0;
  read(__fd,&local_50,8);
  __nbytes_00 = local_50;
  __ptr = calloc(1,local_50);
  uVar3 = 0;
  if (__nbytes_00 != 0) {
    do {
      sVar2 = read(__fd,(void *)((long)__ptr + (long)(int)uVar3),__nbytes_00);
      uVar1 = (int)sVar2 + (int)uVar3;
      uVar3 = (ulong)uVar1;
      __nbytes_00 = __nbytes_00 - (long)(int)sVar2;
    } while (__nbytes_00 != 0);
    uVar3 = (ulong)(int)uVar1;
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__ptr,(long)__ptr + uVar3);
  std::__cxx11::string::operator=((string *)__buf,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  free(__ptr);
  return extraout_RAX;
}

Assistant:

void read(int new_socket, string& msg) {
	int valread;
	char buffer_header[sizeof(size_t)] = {0}; 
	valread = read( new_socket , buffer_header, sizeof(size_t));

	size_t msg_size;
	memcpy(&msg_size, buffer_header, sizeof(size_t));

	char* buffer_msg = (char*)malloc(msg_size*sizeof(char));
	memset(buffer_msg, '\0', sizeof(char)*msg_size);
	int length = 0;
	for(length = 0; msg_size != 0; length += valread) {
		valread = read( new_socket , buffer_msg+length, msg_size);
		msg_size -= valread;
	}

	msg = std::string(buffer_msg, length);
	free(buffer_msg);
}